

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O1

void RigidBodyDynamics::CalcMInvTimesTau
               (Model *model,VectorNd *Q,VectorNd *Tau,VectorNd *QDDot,bool update_kinematics)

{
  double *pdVar1;
  double *pdVar2;
  long *plVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  pointer pJVar12;
  pointer ppCVar13;
  CustomJoint *pCVar14;
  pointer pMVar15;
  pointer pMVar16;
  double *pdVar17;
  pointer pSVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  Model *pMVar35;
  undefined1 lhs [8];
  ActualDstType actualDst;
  ulong uVar36;
  double *pdVar37;
  pointer pSVar38;
  undefined8 *puVar39;
  long lVar40;
  int iVar41;
  ulong uVar42;
  double dVar43;
  pointer pMVar44;
  ulong uVar45;
  VectorNd *pVVar46;
  uint uVar47;
  double dVar48;
  long lVar49;
  long lVar50;
  pointer pSVar51;
  pointer pSVar52;
  SpatialTransform *pSVar53;
  undefined7 in_register_00000081;
  SrcEvaluatorType srcEvaluator;
  pointer pSVar54;
  ulong uVar55;
  byte bVar56;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  SpatialMatrix Ia;
  VectorNd tau_temp;
  add_assign_op<double,_double> local_471;
  Model *local_470;
  double local_468;
  double dStack_460;
  Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>
  local_450;
  VectorNd *local_438;
  VectorNd *local_430;
  double local_428;
  double dStack_420;
  undefined1 local_418 [8];
  undefined1 auStack_410 [32];
  double dStack_3f0;
  SpatialMatrix_t local_2f8;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  SpatialMatrix local_158;
  
  bVar56 = 0;
  pSVar54 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  pSVar54 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  local_438 = QDDot;
  local_430 = Tau;
  if (((int)CONCAT71(in_register_00000081,update_kinematics) != 0) &&
     (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7))) {
    uVar55 = 1;
    uVar47 = 2;
    do {
      jcalc_X_lambda_S(model,(model->mJointUpdateOrder).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar55],Q);
      pSVar54 = (model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      *(undefined8 *)
       &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      pSVar54 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      *(undefined8 *)
       &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      pSVar54 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      *(undefined8 *)
       &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      pSVar54 = (model->pA).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      *(undefined8 *)
       &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      Math::SpatialRigidBodyInertia::setSpatialMatrix
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar55,
                 (model->IA).
                 super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                 super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar55);
      uVar55 = (ulong)uVar47;
      uVar36 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar47 = uVar47 + 1;
    } while (uVar55 <= uVar36 && uVar36 - uVar55 != 0);
  }
  uVar55 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar55) {
    pSVar54 = (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar36 = 2;
    uVar45 = 1;
    do {
      uVar42 = uVar36;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar45].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      pdVar37 = (double *)
                ((long)&pSVar54[uVar45].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar37 = 0.0;
      pdVar37[1] = 0.0;
      *(undefined8 *)
       &pSVar54[uVar45].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar54[uVar45].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      uVar36 = (ulong)((int)uVar42 + 1);
      uVar45 = uVar42;
    } while (uVar42 <= uVar55 && uVar55 - uVar42 != 0);
  }
  local_470 = model;
  if ((update_kinematics) && (uVar47 = (int)uVar55 - 1, uVar47 != 0)) {
    uVar55 = (ulong)uVar47;
    dVar48 = (double)(uVar55 * 0x90 + 0x28);
    do {
      pJVar12 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pJVar12[uVar55].mDoFCount == 3) {
        if (pJVar12[uVar55].mJointType == JointTypeCustom) goto LAB_00173057;
        pMVar44 = (model->multdof3_U).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar52 = (model->IA).
                  super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar15 = (model->multdof3_S).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_468 = *(double *)
                     &pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>;
        dStack_460 = *(double *)
                      ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 8);
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x10);
        local_428 = *pdVar37;
        dStack_420 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x20);
        local_168 = *pdVar37;
        dStack_160 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x30);
        local_178 = *pdVar37;
        dStack_170 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x60);
        local_188 = *pdVar37;
        dStack_180 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x90);
        local_198 = *pdVar37;
        dStack_190 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xc0);
        local_1a8 = *pdVar37;
        dStack_1a0 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xf0);
        local_1b8 = *pdVar37;
        dStack_1b0 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x40);
        local_1c8 = *pdVar37;
        dStack_1c0 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x70);
        local_1d8 = *pdVar37;
        dStack_1d0 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xa0);
        dVar43 = *pdVar37;
        dVar57 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xd0);
        dVar21 = *pdVar37;
        dVar22 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x100);
        dVar23 = *pdVar37;
        dVar24 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x50);
        dVar25 = *pdVar37;
        dVar26 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x80);
        dVar27 = *pdVar37;
        dVar28 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xb0);
        dVar29 = *pdVar37;
        dVar30 = pdVar37[1];
        lVar50 = 0;
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xe0);
        dVar31 = *pdVar37;
        dVar32 = pdVar37[1];
        pdVar37 = (double *)
                  ((long)&pSVar52[uVar55].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x110);
        dVar33 = *pdVar37;
        dVar34 = pdVar37[1];
        do {
          dVar5 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar50 + (long)dVar48 + -0x28);
          dVar6 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar50 + (long)dVar48 + -0x20);
          dVar7 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar50 + (long)dVar48 + -0x18);
          dVar8 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar50 + (long)dVar48 + -0x10);
          dVar63 = dStack_170 * dVar6;
          dVar62 = dStack_180 * dVar7;
          dVar64 = dStack_190 * dVar8;
          dVar9 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar50 + (long)dVar48 + -8);
          dVar65 = dStack_1a0 * dVar9;
          dVar10 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar50 + (long)dVar48);
          dVar66 = dStack_1b0 * dVar10;
          *(double *)
           ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar50) =
               local_1b8 * dVar10 +
               local_1a8 * dVar9 +
               local_198 * dVar8 + local_188 * dVar7 + local_178 * dVar6 + local_468 * dVar5;
          *(double *)
           ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar50 + 8) =
               dVar66 + dVar65 + dVar64 + dVar62 + dVar63 + dStack_460 * dVar5;
          dVar63 = dStack_1c0 * dVar6;
          dVar62 = dStack_1d0 * dVar7;
          *(double *)
           ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar50 + 0x10) =
               dVar23 * dVar10 +
               dVar21 * dVar9 +
               dVar43 * dVar8 + local_1d8 * dVar7 + local_1c8 * dVar6 + local_428 * dVar5;
          *(double *)
           ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar50 + 0x18) =
               dVar24 * dVar10 +
               dVar22 * dVar9 + dVar57 * dVar8 + dVar62 + dVar63 + dStack_420 * dVar5;
          dVar62 = dVar5 * dStack_160;
          *(double *)
           ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar50 + 0x20) =
               dVar10 * dVar33 +
               dVar9 * dVar31 + dVar8 * dVar29 + dVar7 * dVar27 + dVar6 * dVar25 + dVar5 * local_168
          ;
          *(double *)
           ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar50 + 0x28) =
               dVar10 * dVar34 +
               dVar9 * dVar32 + dVar8 * dVar30 + dVar7 * dVar28 + dVar6 * dVar26 + dVar62;
          lVar50 = lVar50 + 0x30;
        } while (lVar50 != 0x90);
        *(double *)
         &pMVar44[uVar55].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
             local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        *(double *)
         ((long)&pMVar44[uVar55].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                 m_storage + 8) =
             local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x10);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[2];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x20);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x30);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[6];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[7];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x40);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[8];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[9];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x50);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[10];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xb];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x60);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xc];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xd];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x70);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xe];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xf];
        pdVar37 = (double *)
                  ((long)&pMVar44[uVar55].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x80);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x10];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x11];
        local_418 = (undefined1  [8])
                    ((model->multdof3_S).
                     super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55);
        auStack_410._0_8_ =
             (model->multdof3_U).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar55;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,_3,_3,_0,_3,_3> *)&local_2f8,(SrcXprType *)local_418,
              (assign_op<double,_double> *)&local_158);
        pMVar16 = (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(double *)
         &pMVar16[uVar55].super_Matrix3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage =
             local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        *(double *)
         ((long)&pMVar16[uVar55].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage + 8) =
             local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar37 = (double *)
                  ((long)&pMVar16[uVar55].super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                  0x10);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[2];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3];
        pdVar37 = (double *)
                  ((long)&pMVar16[uVar55].super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                  0x20);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5];
        pdVar37 = (double *)
                  ((long)&pMVar16[uVar55].super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                  0x30);
        *pdVar37 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[6];
        pdVar37[1] = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[7];
        *(double *)
         ((long)&pMVar16[uVar55].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage + 0x40) =
             local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8];
        uVar36 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar55];
        if (uVar36 != 0) {
          local_418 = (undefined1  [8])
                      ((model->IA).
                       super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                       super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar55);
          auStack_410._0_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar55;
          auStack_410._8_8_ =
               (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar55;
          auStack_410._16_8_ = auStack_410._0_8_;
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                    (&local_2f8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                      *)local_418);
          Math::SpatialTransform::toMatrixTranspose
                    ((SpatialMatrix *)local_418,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55);
          Math::SpatialTransform::toMatrix
                    (&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55);
          pSVar52 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar36;
          goto LAB_00173812;
        }
      }
      else if ((pJVar12[uVar55].mDoFCount == 1) && (pJVar12[uVar55].mJointType != JointTypeCustom))
      {
        local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar55);
        local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((model->S).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar55);
        SpatialVector_t::operator=
                  ((model->U).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar55,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_2f8);
        pSVar54 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar38 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar37 = (double *)
                  ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar2 = (double *)
                 ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar1 = (double *)
                 ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar4 = (double *)
                 ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar17 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        pdVar17[uVar55] =
             pdVar2[1] * pdVar4[1] + pdVar37[1] * pdVar1[1] +
             *(double *)
              ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
             *(double *)
              ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
             *pdVar2 * *pdVar4 + *pdVar37 * *pdVar1 +
             *(double *)
              &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
             *(double *)
              &pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        uVar36 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar55];
        if (uVar36 == 0) goto LAB_00173821;
        auStack_410._0_8_ = pSVar38 + uVar55;
        local_418 = (undefined1  [8])
                    ((model->IA).
                     super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                     super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55);
        auStack_410._24_8_ = pdVar17[uVar55];
        auStack_410._8_8_ = auStack_410._0_8_;
        SpatialMatrix_t::
        SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                  (&local_2f8,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                    *)local_418);
        Math::SpatialTransform::toMatrixTranspose
                  ((SpatialMatrix *)local_418,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar55);
        Math::SpatialTransform::toMatrix
                  (&local_158,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar55);
        pSVar52 = (model->IA).
                  super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar36;
LAB_00173812:
        local_450.m_rhs = &local_158.super_Matrix<double,_6,_6,_0,_6,_6>;
        local_450.m_lhs.m_rhs = &local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>;
        local_450.m_lhs.m_lhs = (LhsNested)local_418;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,1>,Eigen::internal::add_assign_op<double,double>>
                  (&pSVar52->super_Matrix<double,_6,_6,_0,_6,_6>,&local_450,&local_471);
      }
      else {
LAB_00173057:
        if (pJVar12[uVar55].mJointType == JointTypeCustom) {
          uVar47 = pJVar12[uVar55].custom_joint_index;
          ppCVar13 = (model->mCustomJoints).
                     super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar55);
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)(ppCVar13[uVar47] + 0x70);
          local_468 = dVar48;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)(ppCVar13[uVar47] + 0x88),
                     (Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                      *)&local_2f8,(assign_op<double,_double> *)local_418,(type)0x0);
          auStack_410._0_8_ =
               (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar47];
          local_418 = (undefined1  [8])(auStack_410._0_8_ + 0x70);
          auStack_410._0_8_ = auStack_410._0_8_ + 0x88;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               0.0;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_2f8,(SrcXprType *)local_418,
                (assign_op<double,_double> *)&local_158);
          dVar43 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          dVar48 = local_468;
          pCVar14 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar47];
          if ((*(pointer *)(pCVar14 + 0xa8) !=
               (pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) ||
             (*(pointer *)(pCVar14 + 0xb0) !=
              (pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[2])) {
            if (((pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[2] != (pointer)0x0 &&
                 (pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[1] != (pointer)0x0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                       SEXT816((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[2]),0) <
                (long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[1])) {
              puVar39 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar39 = operator_new;
              __cxa_throw(puVar39,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                      ((DenseStorage<double,__1,__1,__1,_0> *)(pCVar14 + 0xa0),
                       (long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[2] *
                       (long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[1],
                       (Index)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1],
                       (Index)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2]);
          }
          lVar50 = *(long *)(pCVar14 + 0xa0);
          lVar40 = *(long *)(pCVar14 + 0xb0) * *(long *)(pCVar14 + 0xa8);
          uVar36 = lVar40 - (lVar40 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar40) {
            lVar49 = 0;
            do {
              pdVar2 = (((Matrix<double,_6,_6,_0,_6,_6> *)dVar43)->
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                       m_data.array + lVar49;
              dVar57 = pdVar2[1];
              pdVar37 = (double *)(lVar50 + lVar49 * 8);
              *pdVar37 = *pdVar2;
              pdVar37[1] = dVar57;
              lVar49 = lVar49 + 2;
            } while (lVar49 < (long)uVar36);
          }
          if ((long)uVar36 < lVar40) {
            do {
              *(double *)(lVar50 + uVar36 * 8) =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)dVar43)->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
                   array[uVar36];
              uVar36 = uVar36 + 1;
            } while (lVar40 - uVar36 != 0);
          }
          free((void *)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
          model = local_470;
          uVar36 = (ulong)(local_470->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar55];
          if (uVar36 != 0) {
            local_418 = (undefined1  [8])
                        ((local_470->IA).
                         super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                         super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar55);
            auStack_410._8_8_ =
                 (local_470->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar47];
            auStack_410._0_8_ = auStack_410._8_8_ + 0x88;
            auStack_410._8_8_ = auStack_410._8_8_ + 0xa0;
            auStack_410._16_8_ = auStack_410._0_8_;
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                      (&local_2f8,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                        *)local_418);
            Math::SpatialTransform::toMatrixTranspose
                      ((SpatialMatrix *)local_418,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar55);
            Math::SpatialTransform::toMatrix
                      (&local_158,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar55);
            pSVar52 = (model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar36;
            dVar48 = local_468;
            goto LAB_00173812;
          }
        }
      }
LAB_00173821:
      uVar55 = uVar55 - 1;
      dVar48 = (double)((long)dVar48 + -0x90);
    } while ((int)uVar55 != 0);
  }
  uVar47 = (int)((ulong)((long)(model->mBodies).
                               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(model->mBodies).
                              super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                              .
                              super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249 - 1;
  if (uVar47 != 0) {
    uVar55 = (ulong)uVar47;
    pVVar46 = local_430;
    do {
      pJVar12 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar47 = pJVar12[uVar55].q_index;
      if (pJVar12[uVar55].mDoFCount == 3) {
        if (pJVar12[uVar55].mJointType == JointTypeCustom) goto LAB_0017389d;
        pdVar37 = (pVVar46->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             pdVar37[uVar47];
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             pdVar37[uVar47 + 1];
        local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             pdVar37[uVar47 + 2];
        local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar55);
        local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar55);
        local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)&local_158;
        local_468 = (double)(uVar55 * 0x18);
        Vector3_t::operator=
                  ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar55,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)&local_2f8);
        uVar36 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar55];
        pVVar46 = local_430;
        if (uVar36 != 0) {
          local_418 = (undefined1  [8])
                      ((model->pA).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar55);
          auStack_410._0_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar55;
          auStack_410._8_8_ =
               (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar55;
          auStack_410._16_8_ =
               (long)&(((model->multdof3_u).
                        super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_Vector3d).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
               (long)local_468;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((SpatialVector_t *)&local_2f8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)local_418);
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55,(SpatialVector *)&local_2f8)
          ;
          pSVar54 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar48 = *(double *)
                    ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          *(double *)
           &pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
               (double)local_418 +
               *(double *)
                &pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          *(double *)
           ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
               (double)auStack_410._0_8_ + dVar48;
          pdVar37 = (double *)
                    ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar48 = pdVar37[1];
          pdVar2 = (double *)
                   ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          *pdVar2 = (double)auStack_410._8_8_ + *pdVar37;
          pdVar2[1] = (double)auStack_410._16_8_ + dVar48;
          pdVar37 = (double *)
                    ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar48 = pdVar37[1];
          pdVar2 = (double *)
                   ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          *pdVar2 = (double)auStack_410._24_8_ + *pdVar37;
          pdVar2[1] = dStack_3f0 + dVar48;
          pVVar46 = local_430;
        }
      }
      else if ((pJVar12[uVar55].mDoFCount == 1) && (pJVar12[uVar55].mJointType != JointTypeCustom))
      {
        pSVar54 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar37 = (double *)
                  ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar2 = (double *)
                 ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pSVar38 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar4 = (double *)
                 ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar17 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        pdVar17[uVar55] =
             (pVVar46->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data[uVar47] -
             (pdVar2[1] * pdVar4[1] + pdVar37[1] * pdVar1[1] +
              *(double *)
               ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
              *(double *)
               ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
             *pdVar2 * *pdVar4 + *pdVar37 * *pdVar1 +
             *(double *)
              &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
             *(double *)
              &pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>);
        uVar36 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar55];
        if (uVar36 != 0) {
          pSVar38 = pSVar38 + uVar55;
          pSVar54 = (model->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar48 = pdVar17[uVar55];
          auVar59._0_8_ =
               *(double *)
                &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar48;
          auVar59._8_8_ =
               *(double *)
                ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) * dVar48;
          dVar43 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[uVar55];
          auVar60._8_8_ = dVar43;
          auVar60._0_8_ = dVar43;
          auVar60 = divpd(auVar59,auVar60);
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               auVar60._0_8_ +
               *(double *)
                &(pSVar38->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               auVar60._8_8_ +
               *(double *)
                ((long)&(pSVar38->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          pdVar37 = (double *)
                    ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          auVar61._0_8_ = *pdVar37 * dVar48;
          auVar61._8_8_ = pdVar37[1] * dVar48;
          auVar19._8_8_ = dVar43;
          auVar19._0_8_ = dVar43;
          auVar60 = divpd(auVar61,auVar19);
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               auVar60._0_8_ +
               *(double *)
                ((long)&(pSVar38->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               auVar60._8_8_ +
               *(double *)
                ((long)&(pSVar38->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
          pdVar37 = (double *)
                    ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          auVar58._0_8_ = dVar48 * *pdVar37;
          auVar58._8_8_ = dVar48 * pdVar37[1];
          auVar20._8_8_ = dVar43;
          auVar20._0_8_ = dVar43;
          auVar60 = divpd(auVar58,auVar20);
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
               auVar60._0_8_ +
               *(double *)
                ((long)&(pSVar38->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
               auVar60._8_8_ +
               *(double *)
                ((long)&(pSVar38->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55,(SpatialVector *)&local_2f8)
          ;
          pSVar54 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar48 = *(double *)
                    ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          *(double *)
           &pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
               (double)local_418 +
               *(double *)
                &pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          *(double *)
           ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
               (double)auStack_410._0_8_ + dVar48;
          pdVar37 = (double *)
                    ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar48 = pdVar37[1];
          pdVar2 = (double *)
                   ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          *pdVar2 = (double)auStack_410._8_8_ + *pdVar37;
          pdVar2[1] = (double)auStack_410._16_8_ + dVar48;
          pdVar37 = (double *)
                    ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar48 = pdVar37[1];
          pdVar2 = (double *)
                   ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          *pdVar2 = (double)auStack_410._24_8_ + *pdVar37;
          pdVar2[1] = dStack_3f0 + dVar48;
        }
      }
      else {
LAB_0017389d:
        if (pJVar12[uVar55].mJointType == JointTypeCustom) {
          local_468 = (double)(ulong)pJVar12[uVar55].custom_joint_index;
          pdVar37 = (pVVar46->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          uVar36 = (ulong)*(uint *)((model->mCustomJoints).
                                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)local_468] + 8);
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          if (uVar36 != 0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,uVar36
                       ,1);
          }
          dVar48 = local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          dVar43 = (double)((ulong)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[1] & 0xfffffffffffffffe);
          if (0 < (long)dVar43) {
            lVar50 = 0;
            do {
              pdVar2 = pdVar37 + (ulong)uVar47 + lVar50;
              dVar57 = pdVar2[1];
              pdVar1 = (double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0] + lVar50 * 8);
              *pdVar1 = *pdVar2;
              pdVar1[1] = dVar57;
              lVar50 = lVar50 + 2;
            } while (lVar50 < (long)dVar43);
          }
          if (dVar43 != local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            do {
              *(double *)
               ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0] + (long)dVar43 * 8) = pdVar37[(ulong)uVar47 + (long)dVar43];
              dVar43 = (double)((long)dVar43 + 1);
            } while ((long)dVar43 <
                     (long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[1]);
          }
          pCVar14 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)local_468];
          local_428 = (double)(uVar55 * 0x30);
          pSVar54 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar55;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          if (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              != 0.0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_2f8,
                       (Index)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1],1);
          }
          dVar43 = local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          pMVar44 = (pointer)((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[1] -
                              ((long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[1] >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            lVar50 = 0;
            do {
              pdVar37 = (double *)((long)dVar48 + lVar50 * 8);
              dVar57 = pdVar37[1];
              pdVar2 = (((Matrix<double,_6,_6,_0,_6,_6> *)
                        local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0])->
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                       m_data.array + lVar50;
              *pdVar2 = *pdVar37;
              pdVar2[1] = dVar57;
              lVar50 = lVar50 + 2;
            } while (lVar50 < (long)pMVar44);
          }
          if ((long)pMVar44 <
              (long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[1]) {
            do {
              (((Matrix<double,_6,_6,_0,_6,_6> *)
               local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
              array[(long)pMVar44] = *(double *)((long)dVar48 + (long)pMVar44 * 8);
              pMVar44 = (pointer)((long)(pMVar44->
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                        ).m_storage.m_data.array + 1);
            } while ((pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1] != pMVar44);
          }
          if (0 < (long)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            lVar50 = *(long *)(pCVar14 + 0x78);
            pdVar37 = (double *)(*(long *)(pCVar14 + 0x70) + 0x20);
            pMVar44 = (pointer)0x0;
            do {
              (((Matrix<double,_6,_6,_0,_6,_6> *)
               local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
              array[(long)pMVar44] =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)
                    local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).
                   m_storage.m_data.array[(long)pMVar44] -
                   (*(double *)
                     ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) *
                    pdVar37[1] +
                    *(double *)
                     ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) *
                    pdVar37[-1] +
                    *(double *)
                     ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    pdVar37[-3] +
                   *(double *)
                    ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) *
                   *pdVar37 +
                   *(double *)
                    ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) *
                   pdVar37[-2] +
                   *(double *)
                    &(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * pdVar37[-4]);
              pMVar44 = (pointer)((long)(pMVar44->
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                        ).m_storage.m_data.array + 1);
              pdVar37 = pdVar37 + lVar50;
            } while ((pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1] != pMVar44);
          }
          if (*(pointer *)(pCVar14 + 0xc0) !=
              (pointer)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[1]) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pCVar14 + 0xb8),
                       (Index)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1],1);
          }
          model = local_470;
          lVar50 = *(long *)(pCVar14 + 0xb8);
          uVar36 = *(ulong *)(pCVar14 + 0xc0);
          uVar45 = uVar36 - ((long)uVar36 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar36) {
            lVar40 = 0;
            do {
              pdVar37 = (((Matrix<double,_6,_6,_0,_6,_6> *)dVar43)->
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                        m_data.array + lVar40;
              dVar48 = pdVar37[1];
              pdVar2 = (double *)(lVar50 + lVar40 * 8);
              *pdVar2 = *pdVar37;
              pdVar2[1] = dVar48;
              lVar40 = lVar40 + 2;
            } while (lVar40 < (long)uVar45);
          }
          if ((long)uVar45 < (long)uVar36) {
            do {
              *(double *)(lVar50 + uVar45 * 8) =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)dVar43)->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
                   array[uVar45];
              uVar45 = uVar45 + 1;
            } while (uVar36 != uVar45);
          }
          free((void *)local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
          pVVar46 = local_430;
          uVar36 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar55];
          if (uVar36 != 0) {
            pSVar54 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_418 = (undefined1  [8])
                        ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                        (long)local_428);
            auStack_410._16_8_ =
                 (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)local_468];
            auStack_410._0_8_ = auStack_410._16_8_ + 0x88;
            auStack_410._8_8_ = auStack_410._16_8_ + 0xa0;
            auStack_410._16_8_ = auStack_410._16_8_ + 0xb8;
            plVar3 = (long *)((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                             (long)local_428);
            local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
                 (double)*plVar3;
            local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
                 (double)plVar3[1];
            plVar3 = (long *)((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                             (long)local_428 + 0x10);
            local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
                 (double)*plVar3;
            local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
                 (double)plVar3[1];
            pdVar37 = (double *)
                      ((long)&(pSVar54->super_Matrix<double,_6,_1,_0,_6,_1>).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                      (long)local_428 + 0x20);
            local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
                 *pdVar37;
            local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
                 pdVar37[1];
            local_450.m_lhs.m_lhs = (LhsNested)0x3ff0000000000000;
            Eigen::internal::
            generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
            ::scaleAndAddTo<Eigen::Matrix<double,6,1,0,6,1>>
                      ((Matrix<double,_6,_1,_0,_6,_1> *)&local_2f8,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)auStack_410,(Matrix<double,__1,_1,_0,__1,_1> *)auStack_410._16_8_,
                       (Scalar *)&local_450);
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar55,
                       (SpatialVector *)&local_2f8);
            pSVar54 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar48 = *(double *)
                      ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            *(double *)
             &pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
                 (double)local_418 +
                 *(double *)
                  &pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            *(double *)
             ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
                 (double)auStack_410._0_8_ + dVar48;
            pdVar37 = (double *)
                      ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar48 = pdVar37[1];
            pdVar2 = (double *)
                     ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            *pdVar2 = (double)auStack_410._8_8_ + *pdVar37;
            pdVar2[1] = (double)auStack_410._16_8_ + dVar48;
            pdVar37 = (double *)
                      ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar48 = pdVar37[1];
            pdVar2 = (double *)
                     ((long)&pSVar54[uVar36].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            *pdVar2 = (double)auStack_410._24_8_ + *pdVar37;
            pdVar2[1] = dStack_3f0 + dVar48;
          }
          free((void *)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
        }
      }
      uVar55 = uVar55 - 1;
    } while ((int)uVar55 != 0);
  }
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar55 = 1;
    do {
      uVar47 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar55].q_index;
      uVar11 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar55];
      pSVar18 = (model->X_lambda).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar51 = pSVar18 + uVar55;
      pSVar53 = (SpatialTransform *)&local_2f8;
      for (lVar50 = 9; lVar50 != 0; lVar50 = lVar50 + -1) {
        (pSVar53->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&(pSVar51->E).super_Matrix3d;
        pSVar51 = (pointer)((long)pSVar51 + ((ulong)bVar56 * -2 + 1) * 8);
        pSVar53 = (SpatialTransform *)((long)pSVar53 + (ulong)bVar56 * -0x10 + 8);
      }
      local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
           *(double *)((long)&pSVar18[uVar55].r.super_Vector3d + 0x10);
      local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
           *(double *)
            &pSVar18[uVar55].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      local_2f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
           *(double *)
            ((long)&pSVar18[uVar55].r.super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
      local_468 = (double)uVar55;
      Math::SpatialTransform::apply
                ((SpatialTransform *)&local_2f8,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar11);
      pMVar35 = local_470;
      pSVar54 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar38 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar48 = *(double *)
                ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      *(double *)
       &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           (double)local_418 +
           *(double *)
            &pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      *(double *)
       ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           (double)auStack_410._0_8_ + dVar48;
      pdVar37 = (double *)
                ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar48 = pdVar37[1];
      pdVar2 = (double *)
               ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar2 = (double)auStack_410._8_8_ + *pdVar37;
      pdVar2[1] = (double)auStack_410._16_8_ + dVar48;
      pdVar37 = (double *)
                ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar48 = pdVar37[1];
      pdVar2 = (double *)
               ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar2 = (double)auStack_410._24_8_ + *pdVar37;
      pdVar2[1] = dStack_3f0 + dVar48;
      pJVar12 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pJVar12[uVar55].mDoFCount == 3) {
        if (pJVar12[uVar55].mJointType == JointTypeCustom) goto LAB_00174018;
        local_418 = (undefined1  [8])
                    ((local_470->multdof3_Dinv).
                     super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar55);
        auStack_410._0_8_ =
             (local_470->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar55;
        auStack_410._8_8_ =
             (local_470->multdof3_U).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar55;
        auStack_410._16_8_ =
             (local_470->a).
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar55;
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Vector3_t *)&local_158,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)local_418);
        pdVar37 = (local_438->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        pdVar37[uVar47] =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        pdVar37[uVar47 + 1] =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar37[uVar47 + 2] =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2];
        local_418 = (undefined1  [8])
                    ((pMVar35->a).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar55);
        auStack_410._0_8_ =
             (pMVar35->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar55;
        auStack_410._8_8_ = (CustomJoint *)&local_158;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)local_418,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)local_418);
LAB_00174326:
        iVar41 = SUB84(local_468,0);
      }
      else {
        if ((pJVar12[uVar55].mDoFCount == 1) && (pJVar12[uVar55].mJointType != JointTypeCustom)) {
          pSVar54 = (local_470->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar38 = (local_470->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar37 = (double *)
                    ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar2 = (double *)
                   ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          pdVar1 = (double *)
                   ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar4 = (double *)
                   ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar57 = ((local_470->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar55] -
                   (pdVar2[1] * pdVar4[1] + pdVar37[1] * pdVar1[1] +
                    *(double *)
                     ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    *(double *)
                     ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar2 * *pdVar4 + *pdVar37 * *pdVar1 +
                   *(double *)
                    &pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)) *
                   (1.0 / (local_470->d).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data[uVar55]);
          (local_438->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_data[uVar47] = dVar57;
          pSVar38 = (local_470->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar43 = *(double *)
                    ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar48 = *(double *)
                    ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          *(double *)
           &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
               *(double *)
                &pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar57 +
               *(double *)
                &pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          *(double *)
           ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
               dVar43 * dVar57 + dVar48;
          pdVar37 = (double *)
                    ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar43 = pdVar37[1];
          pdVar2 = (double *)
                   ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar48 = pdVar2[1];
          pdVar1 = (double *)
                   ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          *pdVar1 = *pdVar37 * dVar57 + *pdVar2;
          pdVar1[1] = dVar43 * dVar57 + dVar48;
          pdVar37 = (double *)
                    ((long)&pSVar38[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar43 = pdVar37[1];
          pdVar2 = (double *)
                   ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar48 = pdVar2[1];
          pdVar1 = (double *)
                   ((long)&pSVar54[uVar55].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          *pdVar1 = dVar57 * *pdVar37 + *pdVar2;
          pdVar1[1] = dVar57 * dVar43 + dVar48;
          goto LAB_00174326;
        }
LAB_00174018:
        iVar41 = SUB84(local_468,0);
        if (pJVar12[uVar55].mJointType == JointTypeCustom) {
          uVar11 = pJVar12[uVar55].custom_joint_index;
          ppCVar13 = (local_470->mCustomJoints).
                     super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)*(uint *)(ppCVar13[uVar11] + 8);
          pCVar14 = ppCVar13[uVar11];
          local_418 = (undefined1  [8])(pCVar14 + 0xa0);
          auStack_410._0_8_ = pCVar14 + 0xb8;
          auStack_410._8_8_ = pCVar14 + 0x88;
          auStack_410._16_8_ =
               (local_470->a).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar55;
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
                     *(Index *)(pCVar14 + 0xa8),1);
          dVar48 = (((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)local_418)->m_storage
                   ).m_data.array[1];
          if (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              != dVar48) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
                       (Index)dVar48,1);
          }
          lhs = local_418;
          if (0 < (long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            memset((void *)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0],0,
                   (long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[1] << 3);
          }
          local_450.m_lhs.m_lhs = (LhsNested)0x3ff0000000000000;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,Eigen::DenseShape,Eigen::DenseShape,7>
          ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_158,
                     (Matrix<double,__1,__1,_0,__1,__1> *)lhs,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)auStack_410,(Scalar *)&local_450);
          if (uVar36 != 0) {
            pdVar37 = (local_438->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar45 = 0;
            do {
              pdVar37[uVar47 + (int)uVar45] =
                   *(double *)
                    ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] + uVar45 * 8);
              uVar45 = uVar45 + 1;
            } while (uVar36 != uVar45);
          }
          local_418 = (undefined1  [8])
                      ((local_470->a).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar55);
          auStack_410._0_8_ =
               (local_470->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11] + 0x70;
          auStack_410._8_8_ = &local_158;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)local_418,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)local_418);
          free((void *)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
          goto LAB_00174326;
        }
      }
      uVar55 = (ulong)(iVar41 + 1);
      uVar36 = ((long)(local_470->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_470->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      model = local_470;
    } while (uVar55 <= uVar36 && uVar36 - uVar55 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcMInvTimesTau ( Model &model,
    const VectorNd &Q,
    const VectorNd &Tau,
    VectorNd &QDDot,
    bool update_kinematics) {

  LOG << "Q          = " << Q.transpose() << std::endl;
  LOG << "---" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].setZero();

  if (update_kinematics) {
    for (unsigned int i = 1; i < model.mBodies.size(); i++) {
      jcalc_X_lambda_S (model, model.mJointUpdateOrder[i], Q);

      model.v_J[i].setZero();
      model.v[i].setZero();
      model.c[i].setZero();
      model.pA[i].setZero();
      model.I[i].setSpatialMatrix (model.IA[i]);
    }
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    model.pA[i].setZero();
  }

  // ClearLogOutput();

  if (update_kinematics) {
    // Compute Articulate Body Inertias
    for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
      unsigned int q_index = model.mJoints[i].q_index;

      if (model.mJoints[i].mDoFCount == 1
          && model.mJoints[i].mJointType != JointTypeCustom) {
        model.U[i] = model.IA[i] * model.S[i];
        model.d[i] = model.S[i].dot(model.U[i]);
        //      LOG << "u[" << i << "] = " << model.u[i] << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] - 
            model.U[i] * (model.U[i] / model.d[i]).transpose();

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mDoFCount == 3
          && model.mJoints[i].mJointType != JointTypeCustom) {

        model.multdof3_U[i] = model.IA[i] * model.multdof3_S[i];

#ifdef RBDL_USE_CASADI_MATH
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose() * model.multdof3_U[i]).inverse();
#else
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose()*model.multdof3_U[i]).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u[i].transpose() << std::endl;

        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i]
            - ( model.multdof3_U[i]
                * model.multdof3_Dinv[i]
                * model.multdof3_U[i].transpose());

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mJointType == JointTypeCustom) {
        unsigned int kI     = model.mJoints[i].custom_joint_index;
        unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
        model.mCustomJoints[kI]->U = model.IA[i] * model.mCustomJoints[kI]->S;

#ifdef RBDL_USE_CASADI_MATH
        model.mCustomJoints[kI]->Dinv=(model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse();
#else
        model.mCustomJoints[kI]->Dinv = (model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u.transpose() << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] 
            - ( model.mCustomJoints[kI]->U
                * model.mCustomJoints[kI]->Dinv
                * model.mCustomJoints[kI]->U.transpose());
#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      }
    }
  }

  // compute articulated bias forces
  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {

      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);
      // LOG << "u[" << i << "] = " << model.u[i] << std::endl;
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialVector pa = model.pA[i] + model.U[i] * model.u[i] / model.d[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {

      Vector3d tau_temp ( Tau[q_index],
          Tau[q_index + 1],
          Tau[q_index + 2]);
      model.multdof3_u[i] = tau_temp 
        - model.multdof3_S[i].transpose()*model.pA[i];
      //      LOG << "multdof3_u[" << i << "] = "
      // << model.multdof3_u[i].transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + model.multdof3_U[i]
          * model.multdof3_Dinv[i]
          * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd tau_temp(Tau.block(q_index,0,dofI,1));

      model.mCustomJoints[kI]->u = 
        tau_temp - ( model.mCustomJoints[kI]->S.transpose()* model.pA[i]);
      //      LOG << "mCustomJoints[kI]->u"
      // << model.mCustomJoints[kI]->u.transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + (   model.mCustomJoints[kI]->U
              * model.mCustomJoints[kI]->Dinv
              * model.mCustomJoints[kI]->u);

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    }
  }

  //  ClearLogOutput();

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i])*(model.u[i]-model.U[i].dot(model.a[i]));
      model.a[i]     = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = 
        model.multdof3_Dinv[i] * (model.multdof3_u[i]
            - model.multdof3_U[i].transpose()*model.a[i]);

      QDDot[q_index]      = qdd_temp[0];
      QDDot[q_index + 1]  = qdd_temp[1];
      QDDot[q_index + 2]  = qdd_temp[2];
      model.a[i]          = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;

      VectorNd qdd_temp = model.mCustomJoints[kI]->Dinv
        * (  model.mCustomJoints[kI]->u 
            - model.mCustomJoints[kI]->U.transpose() * model.a[i]);

      for(unsigned z = 0; z < dofI; ++z){
        QDDot[q_index+z]      = qdd_temp[z];
      }

      model.a[i] =    model.a[i]
        + model.mCustomJoints[kI]->S * qdd_temp;
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}